

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gop_structure.c
# Opt level: O0

void set_frame_parallel_level
               (int *frame_parallel_level,int *parallel_frame_count,int max_parallel_frames)

{
  int max_parallel_frames_local;
  int *parallel_frame_count_local;
  int *frame_parallel_level_local;
  
  *frame_parallel_level = (1 < *parallel_frame_count) + 1;
  *parallel_frame_count = *parallel_frame_count + 1;
  if (max_parallel_frames < *parallel_frame_count) {
    *parallel_frame_count = 1;
  }
  return;
}

Assistant:

static void set_frame_parallel_level(int *frame_parallel_level,
                                     int *parallel_frame_count,
                                     int max_parallel_frames) {
  assert(*parallel_frame_count > 0);
  // parallel_frame_count > 1 indicates subsequent frame(s) in the current
  // parallel encode set.
  *frame_parallel_level = 1 + (*parallel_frame_count > 1);
  // Update the count of no. of parallel frames.
  (*parallel_frame_count)++;
  if (*parallel_frame_count > max_parallel_frames) *parallel_frame_count = 1;
}